

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O2

void __thiscall Fl_Widget_Type::write_widget_code(Fl_Widget_Type *this)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  Fl_Image *pFVar5;
  Fl_Color color;
  Fl_Type *pFVar7;
  uchar uVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  undefined4 extraout_var;
  char *pcVar12;
  Fl_Widget *pFVar13;
  byte bVar14;
  char *var;
  int i;
  uint uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int s;
  Fl_Color c;
  Fl_Font f;
  Fl_Color fc;
  int fs;
  Fl_Font ff;
  double local_38;
  
  pFVar7 = (this->super_Fl_Type).factory[1].prev;
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])();
  pcVar10 = (this->super_Fl_Type).name_;
  var = "o";
  if (pcVar10 != (char *)0x0) {
    var = pcVar10;
  }
  if (iVar9 != 0) {
    var = "this";
  }
  if ((this->tooltip_ != (char *)0x0) && (*this->tooltip_ != '\0')) {
    pcVar10 = indent();
    write_c("%s%s->tooltip(",pcVar10,var);
    pcVar10 = i18n_set;
    if (i18n_type == 2) {
      pcVar11 = "_catalog";
      if (*i18n_file != '\0') {
        pcVar11 = i18n_file;
      }
      iVar9 = Fl_Type::msgnum(&this->super_Fl_Type);
      write_c("catgets(%s,%s,%d,",pcVar11,pcVar10,(ulong)(iVar9 + 1));
LAB_00188bce:
      write_cstring(this->tooltip_);
      write_c(")");
    }
    else {
      if (i18n_type == 1) {
        write_c("%s(",i18n_function);
        goto LAB_00188bce;
      }
      if (i18n_type == 0) {
        write_cstring(this->tooltip_);
      }
    }
    write_c(");\n");
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
  if ((iVar9 == 0) ||
     (lVar16 = 0x134, *(char *)((long)&this->o[2].label_.deimage + 4) == pFVar7[2].rtti)) {
    if (this->o->type_ != (uchar)pFVar7->header_position) {
      iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
      if (iVar9 == 0) {
        lVar16 = 0x6c;
        goto LAB_00188c46;
      }
    }
  }
  else {
LAB_00188c46:
    pcVar10 = indent();
    write_c("%s%s->type(%d);\n",pcVar10,var,
            (ulong)*(byte *)((long)&this->o->_vptr_Fl_Widget + lVar16));
  }
  if ((this->o->box_ != *(uchar *)((long)&pFVar7->header_position + 2)) ||
     (this->subclass_ != (char *)0x0)) {
    pcVar10 = indent();
    pcVar11 = boxname((uint)this->o->box_);
    write_c("%s%s->box(FL_%s);\n",pcVar10,var,pcVar11);
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
  if (iVar9 == 0) {
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])(this);
    lVar16 = 0xac;
    if (iVar9 != 0) goto LAB_00188d04;
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])(this);
    lVar16 = 0x154;
    if (iVar9 != 0) goto LAB_00188d04;
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])(this);
    lVar16 = 400;
    if (iVar9 != 0) goto LAB_00188d04;
  }
  else {
    lVar16 = 0x78;
LAB_00188d04:
    iVar9 = use_FL_COMMAND;
    uVar15 = *(uint *)((long)&this->o->_vptr_Fl_Widget + lVar16);
    if (uVar15 != 0) {
      pcVar10 = indent();
      if (((uVar15 & 0x440000) == 0) || (iVar9 == 0)) {
        pcVar11 = "%s%s->shortcut(0x%x);\n";
      }
      else {
        uVar15 = uVar15 & 0xffbbffff;
        pcVar11 = "%s%s->shortcut(FL_COMMAND|0x%x);\n";
      }
      write_c(pcVar11,pcVar10,var,(ulong)uVar15);
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
  if (iVar9 == 0) {
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])(this);
    iVar9 = strcmp((char *)CONCAT44(extraout_var,iVar9),"Fl_Input_Choice");
    if (iVar9 == 0) {
      pFVar13 = this->o;
      if (pFVar13[1].label_.value[0x89] == '\0') goto LAB_00188e62;
      pcVar10 = indent();
      bVar14 = pFVar13[1].label_.value[0x89];
    }
    else {
      iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])(this);
      if ((iVar9 == 0) || (pFVar13 = this->o, *(char *)((long)&pFVar13[1].callback_ + 1) == '\0'))
      goto LAB_00188e62;
      pcVar10 = indent();
      bVar14 = *(byte *)((long)&pFVar13[1].callback_ + 1);
    }
    pcVar11 = boxname((uint)bVar14);
    write_c("%s%s->down_box(FL_%s);\n",pcVar10,var,pcVar11);
  }
  else {
    pFVar13 = this->o;
    if (*(char *)((long)&pFVar13[1]._vptr_Fl_Widget + 6) != '\0') {
      pcVar10 = indent();
      pcVar11 = boxname((uint)*(byte *)((long)&pFVar13[1]._vptr_Fl_Widget + 6));
      write_c("%s%s->down_box(FL_%s);\n",pcVar10,var,pcVar11);
    }
    if (*(char *)((long)&pFVar13[1]._vptr_Fl_Widget + 4) != '\0') {
      pcVar10 = indent();
      write_c("%s%s->value(1);\n",pcVar10,var);
    }
  }
LAB_00188e62:
  pFVar13 = this->o;
  if ((pFVar13->color_ != *(Fl_Color *)((long)&pFVar7->factory + 4)) ||
     (bVar17 = true, this->subclass_ != (char *)0x0)) {
    write_color(this,"color",pFVar13->color_);
    pFVar13 = this->o;
    bVar17 = this->subclass_ == (char *)0x0;
  }
  if ((pFVar13->color2_ != pFVar7->code_position) || (!bVar17)) {
    write_color(this,"selection_color",pFVar13->color2_);
  }
  if (this->image != (Fluid_Image *)0x0) {
    Fluid_Image::write_code(this->image,var,0);
  }
  if (this->inactive != (Fluid_Image *)0x0) {
    Fluid_Image::write_code(this->inactive,var,1);
  }
  pFVar13 = this->o;
  if (((pFVar13->label_).type != *(uchar *)&pFVar7->prev) ||
     (bVar17 = true, this->subclass_ != (char *)0x0)) {
    pcVar10 = indent();
    pcVar11 = item_name(labeltypemenu,(uint)(this->o->label_).type);
    write_c("%s%s->labeltype(FL_%s);\n",pcVar10,var,pcVar11);
    pFVar13 = this->o;
    bVar17 = this->subclass_ == (char *)0x0;
  }
  if (((pFVar13->label_).font != pFVar7->level) || (bVar18 = true, !bVar17)) {
    pcVar10 = indent();
    write_c("%s%s->labelfont(%d);\n",pcVar10,var,(ulong)(uint)(this->o->label_).font);
    pFVar13 = this->o;
    bVar18 = this->subclass_ == (char *)0x0;
  }
  if (((pFVar13->label_).size != *(int *)&pFVar7->field_0x4c) || (bVar17 = true, !bVar18)) {
    pcVar10 = indent();
    write_c("%s%s->labelsize(%d);\n",pcVar10,var,(ulong)(uint)(this->o->label_).size);
    pFVar13 = this->o;
    bVar17 = this->subclass_ == (char *)0x0;
  }
  color = (pFVar13->label_).color;
  if ((color != *(Fl_Color *)&pFVar7->next) || (!bVar17)) {
    write_color(this,"labelcolor",color);
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
  if (iVar9 != 0) {
    pFVar13 = this->o;
    if (((double)pFVar13[1].callback_ != (double)pFVar7[1].label_) ||
       (NAN((double)pFVar13[1].callback_) || NAN((double)pFVar7[1].label_))) {
      pcVar10 = indent();
      write_c("%s%s->minimum(%g);\n",(int)pFVar13[1].callback_,pcVar10,var);
    }
    if (((double)pFVar13[1].user_data_ != (double)pFVar7[1].callback_) ||
       (NAN((double)pFVar13[1].user_data_) || NAN((double)pFVar7[1].callback_))) {
      pcVar10 = indent();
      write_c("%s%s->maximum(%g);\n",(int)pFVar13[1].user_data_,pcVar10,var);
    }
    uVar3 = pFVar13[1].x_;
    uVar6 = pFVar13[1].y_;
    auVar19._4_4_ = uVar6;
    auVar19._0_4_ = uVar3;
    auVar19._8_8_ = pFVar7[1].user_data_;
    auVar20._8_4_ = SUB84((double)*(int *)&pFVar7[1].user_data_type_,0);
    auVar20._0_8_ = (double)pFVar13[1].w_;
    auVar20._12_4_ = (int)((ulong)(double)*(int *)&pFVar7[1].user_data_type_ >> 0x20);
    auVar20 = divpd(auVar19,auVar20);
    if ((auVar20._0_8_ != auVar20._8_8_) || (NAN(auVar20._0_8_) || NAN(auVar20._8_8_))) {
      pcVar10 = indent();
      write_c("%s%s->step(%g);\n",SUB84(*(double *)&pFVar13[1].x_ / (double)pFVar13[1].w_,0),pcVar10
              ,var);
    }
    if (((double)pFVar13[1]._vptr_Fl_Widget != 0.0) || (NAN((double)pFVar13[1]._vptr_Fl_Widget))) {
      iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
      pcVar10 = indent();
      pcVar11 = "%s%s->value(%g);\n";
      if (iVar9 == 3) {
        pcVar11 = "%s%s->Fl_Slider::value(%g);\n";
      }
      write_c(pcVar11,(int)pFVar13[1]._vptr_Fl_Widget,pcVar10,var);
    }
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
    if (1 < iVar9) {
      fVar2 = (float)pFVar13[1].h_;
      pfVar1 = (float *)((long)&pFVar7[1].user_data_type_ + 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        local_38 = (double)fVar2;
        pcVar10 = indent();
        write_c("%s%s->slider_size(%g);\n",SUB84(local_38,0),pcVar10,var);
      }
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
  if (iVar9 != 0) {
    pFVar13 = this->o;
    pcVar10 = pFVar13[1].label_.value;
    if (((double)pcVar10 != (double)pFVar7[1].comment_) ||
       (NAN((double)pcVar10) || NAN((double)pFVar7[1].comment_))) {
      pcVar10 = indent();
      write_c("%s%s->minimum(%g);\n",(int)pFVar13[1].label_.value,pcVar10,var);
    }
    pFVar5 = pFVar13[1].label_.image;
    if (((double)pFVar5 != (double)pFVar7[1].parent) ||
       (NAN((double)pFVar5) || NAN((double)pFVar7[1].parent))) {
      pcVar10 = indent();
      write_c("%s%s->maximum(%g);\n",(int)pFVar13[1].label_.image,pcVar10,var);
    }
    pFVar5 = pFVar13[1].label_.deimage;
    if (((double)pFVar5 != *(double *)&pFVar7[1].new_selected) ||
       (NAN((double)pFVar5) || NAN(*(double *)&pFVar7[1].new_selected))) {
      pcVar10 = indent();
      write_c("%s%s->step(%g);\n",(int)pFVar13[1].label_.deimage,pcVar10,var);
    }
    if ((*(double *)&pFVar13[1].w_ != 1.0) || (NAN(*(double *)&pFVar13[1].w_))) {
      pcVar10 = indent();
      uVar4 = pFVar13[1].w_;
      write_c("%s%s->value(%g);\n",uVar4,pcVar10,var);
    }
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,4,&ff,&fs,&fc);
  if (iVar9 != 0) {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,0,&f,&s,&c);
    if (f != ff) {
      pcVar10 = indent();
      write_c("%s%s->textfont(%d);\n",pcVar10,var,(ulong)(uint)f);
    }
    if (s != fs) {
      pcVar10 = indent();
      write_c("%s%s->textsize(%d);\n",pcVar10,var,(ulong)(uint)s);
    }
    if (c != fc) {
      write_color(this,"textcolor",c);
    }
  }
  pcVar10 = (this->super_Fl_Type).user_data_;
  pcVar11 = Fl_Type::class_name(&this->super_Fl_Type,1);
  if (pcVar11 != (char *)0x0) {
    iVar9 = (*((this->super_Fl_Type).parent)->_vptr_Fl_Type[0x17])();
    if (iVar9 == 0) {
      pcVar10 = "this";
    }
  }
  if ((this->super_Fl_Type).callback_ == (char *)0x0) {
    if (pcVar10 != (char *)0x0) {
      pcVar11 = indent();
      write_c("%s%s->user_data((void*)(%s));\n",pcVar11,var,pcVar10);
    }
  }
  else {
    pcVar11 = indent();
    pcVar12 = Fl_Type::callback_name(&this->super_Fl_Type);
    write_c("%s%s->callback((Fl_Callback*)%s",pcVar11,var,pcVar12);
    if (pcVar10 == (char *)0x0) {
      write_c(");\n");
    }
    else {
      write_c(", (void*)(%s));\n",pcVar10);
    }
  }
  pFVar13 = this->o;
  uVar15 = (pFVar13->label_).align_;
  if ((uVar15 != *(uint *)((long)&pFVar7->next + 4)) ||
     (bVar17 = true, this->subclass_ != (char *)0x0)) {
    pcVar10 = indent();
    pcVar11 = item_name(alignmenu,uVar15 & 0xffffffef);
    write_c("%s%s->align(Fl_Align(%s",pcVar10,var,pcVar11);
    if ((uVar15 & 0x10) != 0) {
      write_c("|FL_ALIGN_INSIDE");
    }
    write_c("));\n");
    pFVar13 = this->o;
    bVar17 = this->subclass_ == (char *)0x0;
  }
  bVar14 = 0;
  if (pFVar13->when_ != 2) {
    bVar14 = pFVar13->when_;
  }
  if ((bVar14 != *(byte *)((long)&pFVar7->header_position + 3)) || (!bVar17)) {
    pcVar10 = indent();
    pcVar11 = item_name(whensymbolmenu,(uint)bVar14);
    write_c("%s%s->when(%s);\n",pcVar10,var,pcVar11);
    pFVar13 = this->o;
  }
  uVar15 = pFVar13->flags_;
  if (((uVar15 & 2) != 0) && (pFVar13->parent_ != (Fl_Group *)0x0)) {
    pcVar10 = indent();
    write_c("%s%s->hide();\n",pcVar10,var);
    uVar15 = this->o->flags_;
  }
  if ((uVar15 & 1) != 0) {
    pcVar10 = indent();
    write_c("%s%s->deactivate();\n",pcVar10,var);
  }
  iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x20])(this);
  if (iVar9 == 0) {
    uVar8 = resizable(this);
    if (uVar8 != '\0') {
      pcVar10 = indent();
      write_c("%sFl_Group::current()->resizable(%s);\n",pcVar10,var);
    }
  }
  if (this->hotspot_ != '\0') {
    iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])(this);
    if (iVar9 == 0) {
      iVar9 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
      pcVar10 = indent();
      if (iVar9 == 0) {
        pcVar11 = "%s%s->window()->hotspot(%s);\n";
      }
      else {
        pcVar11 = "%s%s->hotspot(%s);\n";
      }
      write_c(pcVar11,pcVar10,var,var);
    }
    else {
      pcVar10 = indent();
      write_c("%shotspot(%s);\n",pcVar10,var);
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::write_widget_code() {
  Fl_Widget* tplate = ((Fl_Widget_Type*)factory)->o;
  const char *var = is_class() ? "this" : name() ? name() : "o";

  if (tooltip() && *tooltip()) {
    write_c("%s%s->tooltip(",indent(), var);
    switch (i18n_type) {
    case 0 : /* None */
        write_cstring(tooltip());
        break;
    case 1 : /* GNU gettext */
        write_c("%s(", i18n_function);
        write_cstring(tooltip());
	write_c(")");
        break;
    case 2 : /* POSIX catgets */
        write_c("catgets(%s,%s,%d,", i18n_file[0] ? i18n_file : "_catalog",
	        i18n_set, msgnum() + 1);
        write_cstring(tooltip());
	write_c(")");
        break;
    }
    write_c(");\n");
  }

  if (is_spinner() && ((Fl_Spinner*)o)->type() != ((Fl_Spinner*)tplate)->type())
    write_c("%s%s->type(%d);\n", indent(), var, ((Fl_Spinner*)o)->type());
  else if (o->type() != tplate->type() && !is_window())
    write_c("%s%s->type(%d);\n", indent(), var, o->type());
  if (o->box() != tplate->box() || subclass())
    write_c("%s%s->box(FL_%s);\n", indent(), var, boxname(o->box()));

  // write shortcut command if needed
  int shortcut = 0;
  if (is_button()) shortcut = ((Fl_Button*)o)->shortcut();
  else if (is_input()) shortcut = ((Fl_Input_*)o)->shortcut();
  else if (is_value_input()) shortcut = ((Fl_Value_Input*)o)->shortcut();
  else if (is_text_display()) shortcut = ((Fl_Text_Display*)o)->shortcut();
  if (shortcut) {
    if (use_FL_COMMAND && (shortcut & (FL_CTRL|FL_META))) {
      write_c("%s%s->shortcut(FL_COMMAND|0x%x);\n", indent(), var, shortcut & ~(FL_CTRL|FL_META));
    } else {
      write_c("%s%s->shortcut(0x%x);\n", indent(), var, shortcut);
    }
  }

  if (is_button()) {
    Fl_Button* b = (Fl_Button*)o;
    if (b->down_box()) write_c("%s%s->down_box(FL_%s);\n", indent(), var,
			       boxname(b->down_box()));
    if (b->value()) write_c("%s%s->value(1);\n", indent(), var);
  } else if (!strcmp(type_name(), "Fl_Input_Choice")) {
    Fl_Input_Choice* b = (Fl_Input_Choice*)o;
    if (b->down_box()) write_c("%s%s->down_box(FL_%s);\n", indent(), var,
			       boxname(b->down_box()));
  } else if (is_menu_button()) {
    Fl_Menu_* b = (Fl_Menu_*)o;
    if (b->down_box()) write_c("%s%s->down_box(FL_%s);\n", indent(), var,
			       boxname(b->down_box()));
  }
  if (o->color() != tplate->color() || subclass())
    write_color("color", o->color());
  if (o->selection_color() != tplate->selection_color() || subclass())
    write_color("selection_color", o->selection_color());
  if (image) image->write_code(var);
  if (inactive) inactive->write_code(var, 1);
  if (o->labeltype() != tplate->labeltype() || subclass())
    write_c("%s%s->labeltype(FL_%s);\n", indent(), var,
	    item_name(labeltypemenu, o->labeltype()));
  if (o->labelfont() != tplate->labelfont() || subclass())
    write_c("%s%s->labelfont(%d);\n", indent(), var, o->labelfont());
  if (o->labelsize() != tplate->labelsize() || subclass())
    write_c("%s%s->labelsize(%d);\n", indent(), var, o->labelsize());
  if (o->labelcolor() != tplate->labelcolor() || subclass())
    write_color("labelcolor", o->labelcolor());
  if (is_valuator()) {
    Fl_Valuator* v = (Fl_Valuator*)o;
    Fl_Valuator* f = (Fl_Valuator*)(tplate);
    if (v->minimum()!=f->minimum())
      write_c("%s%s->minimum(%g);\n", indent(), var, v->minimum());
    if (v->maximum()!=f->maximum())
      write_c("%s%s->maximum(%g);\n", indent(), var, v->maximum());
    if (v->step()!=f->step())
      write_c("%s%s->step(%g);\n", indent(), var, v->step());
    if (v->value()) {
      if (is_valuator()==3) { // Fl_Scrollbar::value(double) is nott available
        write_c("%s%s->Fl_Slider::value(%g);\n", indent(), var, v->value());
      } else {
        write_c("%s%s->value(%g);\n", indent(), var, v->value());
      }
    }
    if (is_valuator()>=2) {
      double x = ((Fl_Slider*)v)->slider_size();
      double y = ((Fl_Slider*)f)->slider_size();
      if (x != y) write_c("%s%s->slider_size(%g);\n", indent(), var, x);
    }
  }
  if (is_spinner()) {
    Fl_Spinner* v = (Fl_Spinner*)o;
    Fl_Spinner* f = (Fl_Spinner*)(tplate);
    if (v->minimum()!=f->minimum())
      write_c("%s%s->minimum(%g);\n", indent(), var, v->minimum());
    if (v->maximum()!=f->maximum())
      write_c("%s%s->maximum(%g);\n", indent(), var, v->maximum());
    if (v->step()!=f->step())
      write_c("%s%s->step(%g);\n", indent(), var, v->step());
    if (v->value()!=1.0f)
      write_c("%s%s->value(%g);\n", indent(), var, v->value());
  }

  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_c("%s%s->textfont(%d);\n", indent(), var, f);
    if (s != fs) write_c("%s%s->textsize(%d);\n", indent(), var, s);
    if (c != fc) write_color("textcolor", c);
  }}
  const char* ud = user_data();
  if (class_name(1) && !parent->is_widget()) ud = "this";
  if (callback()) {
    write_c("%s%s->callback((Fl_Callback*)%s", indent(), var, callback_name());
    if (ud)
      write_c(", (void*)(%s));\n", ud);
    else
      write_c(");\n");
  } else if (ud) {
    write_c("%s%s->user_data((void*)(%s));\n", indent(), var, ud);
  }
  if (o->align() != tplate->align() || subclass()) {
    int i = o->align();
    write_c("%s%s->align(Fl_Align(%s", indent(), var,
	    item_name(alignmenu, i & ~FL_ALIGN_INSIDE));
    if (i & FL_ALIGN_INSIDE) write_c("|FL_ALIGN_INSIDE");
    write_c("));\n");
  }
  // avoid the unsupported combination of flegs when user sets 
  // "when" to "FL_WHEN_NEVER", but keeps the "no change" set. 
  // FIXME: This could be reflected in the GUI by graying out the button.
  Fl_When ww = o->when();
  if (ww==FL_WHEN_NOT_CHANGED)
    ww = FL_WHEN_NEVER;
  if (ww != tplate->when() || subclass())
    write_c("%s%s->when(%s);\n", indent(), var,
            item_name(whensymbolmenu, ww));
  if (!o->visible() && o->parent())
    write_c("%s%s->hide();\n", indent(), var);
  if (!o->active())
    write_c("%s%s->deactivate();\n", indent(), var);
  if (!is_group() && resizable())
    write_c("%sFl_Group::current()->resizable(%s);\n", indent(), var);
  if (hotspot()) {
    if (is_class())
      write_c("%shotspot(%s);\n", indent(), var);
    else if (is_window())
      write_c("%s%s->hotspot(%s);\n", indent(), var, var);
    else
      write_c("%s%s->window()->hotspot(%s);\n", indent(), var, var);
  }
}